

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     *that,allocator_type *a)

{
  bool bVar1;
  ctrl_t h;
  hasher *hashfn;
  key_equal *eq;
  size_t sVar2;
  reference ts;
  size_t *psVar3;
  const_iterator cVar4;
  iterator iVar5;
  FindInfo FVar6;
  FindInfo target;
  size_t hashval;
  value_type *v;
  const_iterator __end0;
  const_iterator __begin0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *__range3;
  allocator_type *a_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *that_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *this_local;
  
  hashfn = hash_ref(that);
  eq = eq_ref(that);
  raw_hash_set(this,0,hashfn,eq,a);
  sVar2 = capacity(that);
  rehash(this,sVar2);
  cVar4 = begin(that);
  __end0.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)cVar4.inner_.ctrl_;
  iVar5 = (iterator)end(that);
  while( true ) {
    __end0.inner_.ctrl_ = (ctrl_t *)iVar5.field_1;
    v = (value_type *)iVar5.ctrl_;
    bVar1 = priv::operator!=((const_iterator *)&__end0.inner_.field_1,(const_iterator *)&v);
    if (!bVar1) break;
    ts = const_iterator::operator*((const_iterator *)&__end0.inner_.field_1);
    target.probe_length = (size_t)hash_ref(this);
    sVar2 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,void>
            ::
            apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>::HashElement,std::pair<phmap::priv::NonStandardLayout_const,int>const&,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>>
                      ((HashElement *)&target.probe_length,ts);
    FVar6 = find_first_non_full(this,sVar2);
    target.offset = FVar6.probe_length;
    h = H2(sVar2);
    set_ctrl(this,FVar6.offset,h);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
    ::emplace_at<std::pair<phmap::priv::NonStandardLayout_const,int>const&>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
                *)this,FVar6.offset,ts);
    HashtablezInfoHandle::RecordInsert
              ((HashtablezInfoHandle *)&this->field_0x20,sVar2,target.offset);
    const_iterator::operator++((const_iterator *)&__end0.inner_.field_1);
    iVar5.field_1.slot_ = (slot_type *)__end0.inner_.ctrl_;
    iVar5.ctrl_ = (ctrl_t *)v;
  }
  sVar2 = size(that);
  this->size_ = sVar2;
  sVar2 = size(that);
  psVar3 = growth_left(this);
  *psVar3 = *psVar3 - sVar2;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
        : raw_hash_set(0, that.hash_ref(), that.eq_ref(), a) {
        rehash(that.capacity());   // operator=() should preserve load_factor
        // Because the table is guaranteed to be empty, we can do something faster
        // than a full `insert`.
        for (const auto& v : that) {
            const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
            auto target = find_first_non_full(hashval);
            set_ctrl(target.offset, H2(hashval));
            emplace_at(target.offset, v);
            infoz_.RecordInsert(hashval, target.probe_length);
        }
        size_ = that.size();
        growth_left() -= that.size();
    }